

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::source_linenum_formatter<spdlog::details::null_scoped_padder>::format
          (source_linenum_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_2,memory_buf_t *dest)

{
  uint uVar1;
  uint value;
  format_decimal_result<char_*> fVar2;
  char acStack_38 [21];
  char acStack_23 [3];
  char *local_20;
  
  uVar1 = (msg->source).line;
  if (uVar1 != 0) {
    value = -uVar1;
    if (0 < (int)uVar1) {
      value = uVar1;
    }
    fVar2 = ::fmt::v9::detail::format_decimal<char,unsigned_int>(acStack_38,value,0x15);
    local_20 = fVar2.begin;
    if ((int)uVar1 < 0) {
      local_20[-1] = '-';
      local_20 = local_20 + -1;
    }
    if ((long)(acStack_38 + -(long)local_20) < -0x15) {
      ::fmt::v9::detail::assert_fail
                ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                 ,0x199,"negative value");
    }
    ::fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_20,
               local_20 + (long)(acStack_38 + -(long)local_20 + 0x15));
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_hour, dest);
    }